

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

void __thiscall HTTPSession::HTTPSession(HTTPSession *this,Socket *in_sock)

{
  rep rVar1;
  
  Jupiter::Socket::Socket(&this->sock,in_sock);
  (this->request)._M_dataplus._M_p = (pointer)&(this->request).field_2;
  (this->request)._M_string_length = 0;
  (this->request).field_2._M_local_buf[0] = '\0';
  this->keep_alive = false;
  this->host = (Host *)0x0;
  this->version = HTTP_1_0;
  rVar1 = std::chrono::_V2::steady_clock::now();
  (this->last_active).__d.__r = rVar1;
  return;
}

Assistant:

HTTPSession::HTTPSession(Jupiter::Socket&& in_sock)
	: sock(std::move(in_sock)) {
}